

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sSyncTests.cpp
# Opt level: O0

int __thiscall deqp::gles3::Stress::SyncTests::init(SyncTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  FenceSyncCase *pFVar1;
  SyncTests *this_local;
  
  pFVar1 = (FenceSyncCase *)operator_new(0xd0);
  FenceSyncCase::FenceSyncCase
            (pFVar1,(this->super_TestCaseGroup).m_context,"wait_sync_10_syncs","",10,1);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar1);
  pFVar1 = (FenceSyncCase *)operator_new(0xd0);
  FenceSyncCase::FenceSyncCase
            (pFVar1,(this->super_TestCaseGroup).m_context,"wait_sync_1000_syncs","",1000,1);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar1);
  pFVar1 = (FenceSyncCase *)operator_new(0xd0);
  FenceSyncCase::FenceSyncCase
            (pFVar1,(this->super_TestCaseGroup).m_context,"wait_sync_10000_syncs","",10000,1);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar1);
  pFVar1 = (FenceSyncCase *)operator_new(0xd0);
  FenceSyncCase::FenceSyncCase
            (pFVar1,(this->super_TestCaseGroup).m_context,"client_wait_sync_10_syncs","",10,2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar1);
  pFVar1 = (FenceSyncCase *)operator_new(0xd0);
  FenceSyncCase::FenceSyncCase
            (pFVar1,(this->super_TestCaseGroup).m_context,"client_wait_sync_1000_syncs","",1000,2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar1);
  pFVar1 = (FenceSyncCase *)operator_new(0xd0);
  FenceSyncCase::FenceSyncCase
            (pFVar1,(this->super_TestCaseGroup).m_context,"client_wait_sync_10000_syncs","",10000,2)
  ;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar1);
  return extraout_EAX;
}

Assistant:

void SyncTests::init (void)
{
	// Fence sync stress tests.

	addChild(new FenceSyncCase(m_context, "wait_sync_10_syncs",				"",	10,		COMMAND_WAIT_SYNC));
	addChild(new FenceSyncCase(m_context, "wait_sync_1000_syncs",			"",	1000,	COMMAND_WAIT_SYNC));
	addChild(new FenceSyncCase(m_context, "wait_sync_10000_syncs",			"",	10000,	COMMAND_WAIT_SYNC));

	addChild(new FenceSyncCase(m_context, "client_wait_sync_10_syncs",		"",	10,		COMMAND_CLIENT_WAIT_SYNC));
	addChild(new FenceSyncCase(m_context, "client_wait_sync_1000_syncs",	"",	1000,	COMMAND_CLIENT_WAIT_SYNC));
	addChild(new FenceSyncCase(m_context, "client_wait_sync_10000_syncs",	"",	10000,	COMMAND_CLIENT_WAIT_SYNC));
}